

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O2

void __thiscall
Fl_PostScript_Graphics_Driver::pie
          (Fl_PostScript_Graphics_Driver *this,int x,int y,int w,int h,double a1,double a2)

{
  fwrite("GS\n",3,1,(FILE *)this->output);
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x1b])(this);
  clocale_printf(this,"%g %g TR\n",(double)w * 0.5 + (double)x + -0.5,
                 (double)h * 0.5 + (double)y + -0.5);
  clocale_printf(this,"%g %g SC\n",(double)(w + -1) * 0.5,(double)(h + -1) * 0.5);
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x1c])(0,0,this);
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x1f])
            (0,0,0x3ff0000000000000,a2,a1,this);
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x25])(this);
  fwrite("GR\n",3,1,(FILE *)this->output);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::pie(int x, int y, int w, int h, double a1, double a2) {
  fprintf(output, "GS\n");
  begin_polygon();
  clocale_printf("%g %g TR\n", x + w/2.0 -0.5 , y + h/2.0 - 0.5);
  clocale_printf("%g %g SC\n", (w-1)/2.0 , (h-1)/2.0 );
  vertex(0,0);
  arc(0.0,0.0, 1, a2, a1);
  end_polygon();
  fprintf(output, "GR\n");
}